

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

bool __thiscall
Js::WebAssemblySharedArrayBuffer::GrowMemory
          (WebAssemblySharedArrayBuffer *this,uint32 newBufferLength)

{
  uint uVar1;
  BYTE *pBVar2;
  code *pcVar3;
  anon_class_16_3_a0ccf8c1 externalAllocFunc;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  ScriptContext *scriptContext;
  ulong uVar7;
  Recycler *pRVar8;
  anon_class_16_3_a0ccf8c1 virtualAllocFunc;
  uint32 growSize;
  BYTE *buffer;
  uint32 bufferLength;
  uint32 newBufferLength_local;
  WebAssemblySharedArrayBuffer *this_local;
  
  uVar1 = ((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents)->
          bufferLength;
  pBVar2 = ((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents)->
           buffer;
  if ((uVar1 <= newBufferLength) &&
     (newBufferLength <=
      ((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents)->
      maxBufferLength)) {
    uVar5 = newBufferLength - uVar1;
    if (uVar5 != 0) {
      if (pBVar2 == (BYTE *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                    ,0x247,"(buffer)","buffer");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      uVar7 = (**(code **)((long)(this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.
                                 super_ArrayBufferBase.super_DynamicObject.super_RecyclableObject.
                                 super_FinalizableObject.super_IRecyclerVisitedObject + 0x398))();
      if ((uVar7 & 1) != 0) {
        pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)this);
        externalAllocFunc.growSize = uVar5;
        externalAllocFunc.bufferLength = uVar1;
        externalAllocFunc.buffer = pBVar2;
        bVar4 = Memory::Recycler::
                DoExternalAllocation<Js::WebAssemblySharedArrayBuffer::GrowMemory(unsigned_int)::__0>
                          (pRVar8,(ulong)uVar5,externalAllocFunc);
        if (!bVar4) {
          return false;
        }
        pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)this);
        Memory::Recycler::AddExternalMemoryUsage(pRVar8,(ulong)uVar5);
      }
      memset(pBVar2 + uVar1,0,(ulong)uVar5);
      ((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents)->
      bufferLength = newBufferLength;
      ValidateBuffer(this);
    }
    return true;
  }
  if (((this->super_JavascriptSharedArrayBuffer).super_SharedArrayBuffer.sharedContents)->
      maxBufferLength < newBufferLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                                ,0x23a,"(newBufferLength <= sharedContents->maxBufferLength)",
                                "This shouldn\'t happen");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
                              ,0x23b,"((0))","UNREACHED");
  if (bVar4) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
    scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5e492,(PCWSTR)0x0);
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

_Must_inspect_result_ bool WebAssemblySharedArrayBuffer::GrowMemory(uint32 newBufferLength)
    {
        uint32 bufferLength = sharedContents->bufferLength;
        BYTE* buffer = sharedContents->buffer;
        if (newBufferLength < bufferLength || newBufferLength > sharedContents->maxBufferLength)
        {
            AssertMsg(newBufferLength <= sharedContents->maxBufferLength, "This shouldn't happen");
            Assert(UNREACHED);
            JavascriptError::ThrowTypeError(GetScriptContext(), WASMERR_BufferGrowOnly);
        }

        uint32 growSize = newBufferLength - bufferLength;

        // We're not growing the buffer, do nothing
        if (growSize == 0)
        {
            return true;
        }

        AssertOrFailFast(buffer);
        if (IsValidVirtualBufferLength(newBufferLength))
        {
            auto virtualAllocFunc = [=]
            {
                return !!VirtualAlloc(buffer + bufferLength, growSize, MEM_COMMIT, PAGE_READWRITE);
            };
            if (!this->GetRecycler()->DoExternalAllocation(growSize, virtualAllocFunc))
            {
                return false;
            }

            this->GetRecycler()->AddExternalMemoryUsage(growSize);
        }
        else
        {
            // We have already allocated maxLength in the heap if we're not using virtual alloc
        }
        ZeroMemory(buffer + bufferLength, growSize);
        sharedContents->bufferLength = newBufferLength;
        ValidateBuffer();
        return true;
    }